

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O3

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGLDriver,irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>>
::~COpenGLCoreRenderTarget
          (COpenGLCoreRenderTarget<irr::video::COpenGLDriver,irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>>
           *this)

{
  long lVar1;
  
  lVar1 = *(long *)(*(long *)this + -0x18);
  COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::~COpenGLCoreRenderTarget
            ((COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
              *)(this + lVar1),&VTT);
  operator_delete((COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                   *)(this + lVar1),0xb0);
  return;
}

Assistant:

virtual ~COpenGLCoreRenderTarget()
	{
		if (ColorAttachment > 0 && BufferID != 0)
			Driver->irrGlDeleteFramebuffers(1, &BufferID);

		for (u32 i = 0; i < Textures.size(); ++i) {
			if (Textures[i])
				Textures[i]->drop();
		}

		if (DepthStencil)
			DepthStencil->drop();
	}